

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,LinkInterfaceFor interfaceFor)

{
  PolicyMap *this_00;
  size_t __n;
  cmLocalGenerator *pcVar1;
  cmLinkItem *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  TargetType TVar5;
  int iVar6;
  cmValue __args;
  string *psVar7;
  ostream *poVar8;
  cmLinkImplementationLibraries *rng;
  PolicyID id;
  PolicyID id_00;
  cmLinkItem *l;
  cmLinkItem *r;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmBTStringRange cVar9;
  string_view separator;
  string_view separator_00;
  string linkIfacePropCMP0022OLD;
  string local_338;
  ostream *local_318;
  string *local_310;
  string suffix;
  string newLibraries;
  string oldLibraries;
  size_type __dnew;
  cmLinkItem *pcStack_2a0;
  undefined1 local_298 [16];
  pointer local_288;
  pointer pcStack_280;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_278;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> vStack_260;
  undefined2 local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_228;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [40];
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix.field_2._M_allocated_capacity._0_2_ = 0x5f;
  suffix._M_string_length = 1;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::_M_append((char *)&suffix,(ulong)_w);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_w != local_198) {
      operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
    }
  }
  linkIfacePropCMP0022OLD._M_dataplus._M_p = (pointer)&linkIfacePropCMP0022OLD.field_2;
  linkIfacePropCMP0022OLD._M_string_length = 0;
  linkIfacePropCMP0022OLD.field_2._M_local_buf[0] = '\0';
  this_00 = &this->PolicyMap;
  PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
  if (PVar4 == OLD) {
LAB_003e524a:
    TVar5 = cmTarget::GetType(this->Target);
    if (TVar5 == SHARED_LIBRARY) {
LAB_003e5267:
      _w = (pointer)0x18;
      local_198[0]._M_allocated_capacity = suffix._M_string_length;
      local_198[0]._8_8_ = suffix._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = (iterator)&w;
      cmCatViews_abi_cxx11_((string *)&__dnew,views);
      std::__cxx11::string::operator=((string *)&linkIfacePropCMP0022OLD,(string *)&__dnew);
      if ((undefined1 *)__dnew != local_298) {
        operator_delete((void *)__dnew,local_298._0_8_ + 1);
      }
      __args = GetProperty(this,&linkIfacePropCMP0022OLD);
      if (__args.Value == (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&linkIfacePropCMP0022OLD,0,
                   (char *)linkIfacePropCMP0022OLD._M_string_length,0x78e392);
        __args = GetProperty(this,&linkIfacePropCMP0022OLD);
        if (__args.Value == (string *)0x0) goto LAB_003e5b0e;
      }
      PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
      if ((PVar4 == WARN) && (this->PolicyWarnedCMP0022 == false)) {
        _w = (pointer)local_198;
        __dnew = 0x18;
        _w = (pointer)std::__cxx11::string::_M_create((ulong *)&w,(ulong)&__dnew);
        local_198[0]._M_allocated_capacity = __dnew;
        *(undefined8 *)_w = 0x4341465245544e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 8) = 'E';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 9) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 10) = 'L';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0xb) = 'I';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0xc) = 'N';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0xd) = 'K';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0xe) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0xf) = 'L';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x10) = 'I';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x11) = 'B';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x12) = 'R';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x13) = 'A';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x14) = 'R';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x15) = 'I';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x16) = 'E';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_w + 0x17) = 'S';
        _w[__dnew] = '\0';
        local_310 = (string *)GetProperty(this,(string *)&w);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_w != local_198) {
          operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
        }
        if (local_310 != (string *)0x0) {
          __n = local_310->_M_string_length;
          if (__n == (__args.Value)->_M_string_length) {
            if (__n != 0) {
              iVar6 = bcmp((local_310->_M_dataplus)._M_p,((__args.Value)->_M_dataplus)._M_p,__n);
              if (iVar6 != 0) goto LAB_003e5412;
            }
          }
          else {
LAB_003e5412:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__dnew,(cmPolicies *)0x16,id);
            local_318 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&w,(char *)__dnew,(long)pcStack_2a0);
            std::__ostream_insert<char,std::char_traits<char>>(local_318,"\nTarget \"",9);
            psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_318,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" has an INTERFACE_LINK_LIBRARIES property which differs from its ",
                       0x42);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,linkIfacePropCMP0022OLD._M_dataplus._M_p,
                                linkIfacePropCMP0022OLD._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," properties.\nINTERFACE_LINK_LIBRARIES:\n  ",0x29);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_310->_M_dataplus)._M_p,local_310->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,linkIfacePropCMP0022OLD._M_dataplus._M_p,
                                linkIfacePropCMP0022OLD._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n  ",4);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((__args.Value)->_M_dataplus)._M_p,
                                (__args.Value)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((undefined1 *)__dnew != local_298) {
              operator_delete((void *)__dnew,local_298._0_8_ + 1);
            }
            pcVar1 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&__dnew);
            if ((undefined1 *)__dnew != local_298) {
              operator_delete((void *)__dnew,local_298._0_8_ + 1);
            }
            this->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
            std::ios_base::~ios_base(local_138);
          }
        }
      }
      *(undefined2 *)&(iface->super_cmLinkInterface).field_0xf4 = 0x101;
      _w = (pointer)0x0;
      local_198[0]._M_allocated_capacity = 0;
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)&w,
                 __args.Value);
      cVar9.End._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      cVar9.Begin._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           _w;
      ExpandLinkItems(this,&linkIfacePropCMP0022OLD,cVar9,config,headTarget,interfaceFor,Libraries,
                      &iface->super_cmLinkInterface);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&w);
    }
    else {
      bVar3 = IsExecutableWithExports(this);
      if (bVar3) goto LAB_003e5267;
LAB_003e5b0e:
      bVar3 = false;
LAB_003e5b11:
      TVar5 = cmTarget::GetType(this->Target);
      if (TVar5 == EXECUTABLE) goto LAB_003e5b2a;
      TVar5 = cmTarget::GetType(this->Target);
      if (TVar5 == MODULE_LIBRARY) goto LAB_003e5b2a;
      (iface->super_cmLinkInterface).field_0xf4 = 1;
      if (bVar3) goto LAB_003e567f;
      (iface->super_cmLinkInterface).field_0xf5 = 0;
    }
  }
  else {
    PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
    if (PVar4 == WARN) goto LAB_003e524a;
    cVar9 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    if (cVar9.Begin._M_current._M_current == cVar9.End._M_current._M_current) {
      cVar9 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
      if (cVar9.Begin._M_current._M_current != cVar9.End._M_current._M_current) goto LAB_003e5677;
      cVar9 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
      if (cVar9.Begin._M_current._M_current != cVar9.End._M_current._M_current) goto LAB_003e5677;
      bVar3 = true;
      goto LAB_003e5b11;
    }
LAB_003e5677:
    (iface->super_cmLinkInterface).field_0xf4 = 1;
LAB_003e567f:
    (iface->super_cmLinkInterface).field_0xf5 = 1;
    cVar9 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)&(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,
                    cVar9,config,headTarget,interfaceFor,Libraries,&iface->super_cmLinkInterface);
    cVar9 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)
                         &(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,cVar9,
                    config,headTarget,interfaceFor,HeadInclude,&iface->super_cmLinkInterface);
    cVar9 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)
                         (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
                    cVar9,config,headTarget,interfaceFor,HeadExclude,&iface->super_cmLinkInterface);
  }
  if ((iface->super_cmLinkInterface).field_0xf5 != '\0') goto LAB_003e5b2a;
  rng = GetLinkImplementationLibrariesInternal(this,config,headTarget,interfaceFor);
  if (rng == (cmLinkImplementationLibraries *)0x0) goto LAB_003e5b2a;
  std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>>
            ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
             (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (rng->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (rng->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
  if (((PVar4 != WARN) || (interfaceFor != Link)) || (this->PolicyWarnedCMP0022 != false))
  goto LAB_003e5b2a;
  local_228._M_buckets = &local_228._M_single_bucket;
  vStack_260.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_260.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_260.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288 = (pointer)0x0;
  pcStack_280 = (pointer)0x0;
  local_298._0_8_ = 0;
  local_298._8_8_ = 0;
  __dnew = 0;
  pcStack_2a0 = (cmLinkItem *)0x0;
  local_248._0_1_ = false;
  local_248._1_1_ = false;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228._M_bucket_count = 1;
  local_228._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_228._M_element_count = 0;
  local_228._M_rehash_policy._M_max_load_factor = 1.0;
  local_228._M_rehash_policy._M_next_resize = 0;
  local_228._M_single_bucket = (__node_base_ptr)0x0;
  local_1f0._0_8_ = (pointer)0x0;
  local_1f0._8_4_ = 0;
  local_1f0._12_4_ = 0;
  local_1f0._16_4_ = 0;
  local_1f0._20_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0._8_2_ = 0;
  local_1d0._10_6_ = 0;
  local_1d0._16_2_ = 0;
  local_1d0._18_8_ = 0;
  cVar9 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
  ExpandLinkItems(this,(string *)&(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,cVar9,
                  config,headTarget,Link,Libraries,(cmLinkInterface *)&__dnew);
  pcVar2 = pcStack_2a0;
  r = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)pcStack_2a0 - __dnew ==
      (long)(iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)r) {
    l = (cmLinkItem *)__dnew;
    if ((cmLinkItem *)__dnew != pcStack_2a0) {
      do {
        bVar3 = ::operator==(l,r);
        l = l + 1;
        r = r + 1;
      } while (bVar3 && l != pcVar2);
      if (!bVar3) goto LAB_003e588f;
    }
  }
  else {
LAB_003e588f:
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
              (&oldLibraries,&rng->Libraries,separator);
    separator_00._M_str = ";";
    separator_00._M_len = 1;
    cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
              (&newLibraries,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&__dnew,separator_00
              );
    if (oldLibraries._M_string_length == 0) {
      std::__cxx11::string::operator=((string *)&oldLibraries,"(empty)");
    }
    if (newLibraries._M_string_length == 0) {
      std::__cxx11::string::operator=((string *)&newLibraries,"(empty)");
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_338,(cmPolicies *)0x16,id_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&w,local_338._M_dataplus._M_p,local_338._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nTarget \"",9);
    psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
               ,0x116);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,newLibraries._M_dataplus._M_p,newLibraries._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nLink implementation:\n  ",0x18);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,oldLibraries._M_dataplus._M_p,oldLibraries._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->LocalGenerator;
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    this->PolicyWarnedCMP0022 = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newLibraries._M_dataplus._M_p != &newLibraries.field_2) {
      operator_delete(newLibraries._M_dataplus._M_p,newLibraries.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)oldLibraries._M_dataplus._M_p != &oldLibraries.field_2) {
      operator_delete(oldLibraries._M_dataplus._M_p,oldLibraries.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_1d0);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_1f0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&vStack_260);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_278);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)(local_298 + 8));
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&__dnew);
LAB_003e5b2a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkIfacePropCMP0022OLD._M_dataplus._M_p != &linkIfacePropCMP0022OLD.field_2) {
    operator_delete(linkIfacePropCMP0022OLD._M_dataplus._M_p,
                    CONCAT71(linkIfacePropCMP0022OLD.field_2._M_allocated_capacity._1_7_,
                             linkIfacePropCMP0022OLD.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != &suffix.field_2) {
    operator_delete(suffix._M_dataplus._M_p,
                    CONCAT62(suffix.field_2._M_allocated_capacity._2_6_,
                             suffix.field_2._M_allocated_capacity._0_2_) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, LinkInterfaceFor interfaceFor) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  bool haveExplicitLibraries = false;
  cmValue explicitLibrariesCMP0022OLD;
  std::string linkIfacePropCMP0022OLD;
  bool const cmp0022NEW = (this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
                           this->GetPolicyStatusCMP0022() != cmPolicies::WARN);
  if (cmp0022NEW) {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    haveExplicitLibraries = !this->Target->GetLinkInterfaceEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectExcludeEntries().empty();
  } else {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->IsExecutableWithExports()) {
      // Lookup the per-configuration property.
      linkIfacePropCMP0022OLD = cmStrCat("LINK_INTERFACE_LIBRARIES", suffix);
      explicitLibrariesCMP0022OLD = this->GetProperty(linkIfacePropCMP0022OLD);

      // If not set, try the generic property.
      if (!explicitLibrariesCMP0022OLD) {
        linkIfacePropCMP0022OLD = "LINK_INTERFACE_LIBRARIES";
        explicitLibrariesCMP0022OLD =
          this->GetProperty(linkIfacePropCMP0022OLD);
      }
    }

    if (explicitLibrariesCMP0022OLD &&
        this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022) {
      // Compare the explicitly set old link interface properties to the
      // preferred new link interface property one and warn if different.
      cmValue newExplicitLibraries =
        this->GetProperty("INTERFACE_LINK_LIBRARIES");
      if (newExplicitLibraries &&
          (*newExplicitLibraries != *explicitLibrariesCMP0022OLD)) {
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property which differs from its " <<
          linkIfacePropCMP0022OLD << " properties."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << *newExplicitLibraries << "\n" <<
          linkIfacePropCMP0022OLD << ":\n"
          "  " << *explicitLibrariesCMP0022OLD << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }

    haveExplicitLibraries = static_cast<bool>(explicitLibrariesCMP0022OLD);
  }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if (!haveExplicitLibraries &&
      (this->GetType() == cmStateEnums::EXECUTABLE ||
       (this->GetType() == cmStateEnums::MODULE_LIBRARY))) {
    return;
  }
  iface.Exists = true;

  // If CMP0022 is NEW then the plain tll signature sets the
  // INTERFACE_LINK_LIBRARIES property.  Even if the project
  // clears it, the link interface is still explicit.
  iface.Explicit = cmp0022NEW || explicitLibrariesCMP0022OLD;

  if (cmp0022NEW) {
    // The interface libraries are specified by INTERFACE_LINK_LIBRARIES.
    // Use its special representation directly to get backtraces.
    this->ExpandLinkItems(
      kINTERFACE_LINK_LIBRARIES, this->Target->GetLinkInterfaceEntries(),
      config, headTarget, interfaceFor, LinkInterfaceField::Libraries, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          this->Target->GetLinkInterfaceDirectEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          this->Target->GetLinkInterfaceDirectExcludeEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
  } else if (explicitLibrariesCMP0022OLD) {
    // The interface libraries have been explicitly set in pre-CMP0022 style.
    std::vector<BT<std::string>> entries;
    entries.emplace_back(*explicitLibrariesCMP0022OLD);
    this->ExpandLinkItems(linkIfacePropCMP0022OLD, cmMakeRange(entries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
  }

  // If the link interface is explicit, do not fall back to the link impl.
  if (iface.Explicit) {
    return;
  }

  // The link implementation is the default link interface.
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                     interfaceFor)) {
    iface.Libraries.insert(iface.Libraries.end(), impl->Libraries.begin(),
                           impl->Libraries.end());
    if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022 && interfaceFor == LinkInterfaceFor::Link) {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      cmLinkInterface ifaceNew;
      this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES,
                            this->Target->GetLinkInterfaceEntries(), config,
                            headTarget, interfaceFor,
                            LinkInterfaceField::Libraries, ifaceNew);
      if (ifaceNew.Libraries != iface.Libraries) {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceNew.Libraries, ";");
        if (oldLibraries.empty()) {
          oldLibraries = "(empty)";
        }
        if (newLibraries.empty()) {
          newLibraries = "(empty)";
        }

        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }
  }
}